

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

WebPDemuxer * WebPDemuxInternal(WebPData *data,int allow_partial,WebPDemuxState *state,int version)

{
  int iVar1;
  ParseStatus PVar2;
  uint uVar3;
  int *piVar4;
  int in_ECX;
  WebPDemuxState WVar5;
  WebPDemuxState *in_RDX;
  int in_ESI;
  long *in_RDI;
  WebPDemuxer *dmux;
  MemBuffer mem;
  ParseStatus status;
  int partial;
  ChunkParser *parser;
  MemBuffer *in_stack_ffffffffffffff88;
  WebPDemuxer *in_stack_ffffffffffffff90;
  ChunkParser *pCVar6;
  WebPDemuxer *in_stack_ffffffffffffff98;
  WebPDemuxer *in_stack_ffffffffffffffa0;
  ulong local_50;
  ulong local_48;
  WebPDemuxer **in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffcc;
  ChunkParser *local_30;
  WebPDemuxer *local_8;
  
  if (in_RDX != (WebPDemuxState *)0x0) {
    *in_RDX = WEBP_DEMUX_PARSE_ERROR;
  }
  if (in_ECX >> 8 == 1) {
    if (((in_RDI == (long *)0x0) || (*in_RDI == 0)) || (in_RDI[1] == 0)) {
      local_8 = (WebPDemuxer *)0x0;
    }
    else {
      iVar1 = InitMemBuffer(&in_stack_ffffffffffffff90->mem_,(uint8_t *)in_stack_ffffffffffffff88,
                            0x106ab3);
      if (iVar1 == 0) {
        local_8 = (WebPDemuxer *)0x0;
      }
      else {
        PVar2 = ReadHeader(&in_stack_ffffffffffffff98->mem_);
        if (PVar2 == PARSE_OK) {
          uVar3 = (uint)(local_48 < local_50);
          if ((in_ESI == 0) && (uVar3 != 0)) {
            local_8 = (WebPDemuxer *)0x0;
          }
          else {
            local_8 = (WebPDemuxer *)
                      WebPSafeCalloc((uint64_t)in_stack_ffffffffffffff98,
                                     (size_t)in_stack_ffffffffffffff90);
            if (local_8 == (WebPDemuxer *)0x0) {
              local_8 = (WebPDemuxer *)0x0;
            }
            else {
              InitDemux(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
              PVar2 = PARSE_ERROR;
              for (local_30 = kMasterChunks;
                  local_30->parse != (_func_ParseStatus_WebPDemuxer_ptr *)0x0;
                  local_30 = local_30 + 1) {
                pCVar6 = local_30;
                piVar4 = (int *)GetBuffer(&local_8->mem_);
                if (*(int *)pCVar6->id == *piVar4) {
                  PVar2 = (*local_30->parse)(local_8);
                  if (PVar2 == PARSE_OK) {
                    local_8->state_ = WEBP_DEMUX_DONE;
                  }
                  if ((PVar2 == PARSE_NEED_MORE_DATA) && (uVar3 == 0)) {
                    PVar2 = PARSE_ERROR;
                  }
                  if ((PVar2 != PARSE_ERROR) && (iVar1 = (*local_30->valid)(local_8), iVar1 == 0)) {
                    PVar2 = PARSE_ERROR;
                  }
                  if (PVar2 == PARSE_ERROR) {
                    local_8->state_ = WEBP_DEMUX_PARSE_ERROR;
                  }
                  break;
                }
              }
              if (in_RDX != (WebPDemuxState *)0x0) {
                *in_RDX = local_8->state_;
              }
              if (PVar2 == PARSE_ERROR) {
                WebPDemuxDelete(in_stack_ffffffffffffffa0);
                local_8 = (WebPDemuxer *)0x0;
              }
            }
          }
        }
        else if ((PVar2 == PARSE_ERROR) &&
                (PVar2 = CreateRawImageDemuxer
                                   ((MemBuffer *)CONCAT44(in_stack_ffffffffffffffcc,2),
                                    in_stack_ffffffffffffffc0), PVar2 == PARSE_OK)) {
          local_8 = in_stack_ffffffffffffff98;
          if (in_RDX != (WebPDemuxState *)0x0) {
            *in_RDX = WEBP_DEMUX_DONE;
          }
        }
        else {
          if (in_RDX != (WebPDemuxState *)0x0) {
            WVar5 = WEBP_DEMUX_PARSE_ERROR;
            if (PVar2 == PARSE_NEED_MORE_DATA) {
              WVar5 = WEBP_DEMUX_PARSING_HEADER;
            }
            *in_RDX = WVar5;
          }
          local_8 = (WebPDemuxer *)0x0;
        }
      }
    }
  }
  else {
    local_8 = (WebPDemuxer *)0x0;
  }
  return local_8;
}

Assistant:

WebPDemuxer* WebPDemuxInternal(const WebPData* data, int allow_partial,
                               WebPDemuxState* state, int version) {
  const ChunkParser* parser;
  int partial;
  ParseStatus status = PARSE_ERROR;
  MemBuffer mem;
  WebPDemuxer* dmux;

  if (state != NULL) *state = WEBP_DEMUX_PARSE_ERROR;

  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_DEMUX_ABI_VERSION)) return NULL;
  if (data == NULL || data->bytes == NULL || data->size == 0) return NULL;

  if (!InitMemBuffer(&mem, data->bytes, data->size)) return NULL;
  status = ReadHeader(&mem);
  if (status != PARSE_OK) {
    // If parsing of the webp file header fails attempt to handle a raw
    // VP8/VP8L frame. Note 'allow_partial' is ignored in this case.
    if (status == PARSE_ERROR) {
      status = CreateRawImageDemuxer(&mem, &dmux);
      if (status == PARSE_OK) {
        if (state != NULL) *state = WEBP_DEMUX_DONE;
        return dmux;
      }
    }
    if (state != NULL) {
      *state = (status == PARSE_NEED_MORE_DATA) ? WEBP_DEMUX_PARSING_HEADER
                                                : WEBP_DEMUX_PARSE_ERROR;
    }
    return NULL;
  }

  partial = (mem.buf_size_ < mem.riff_end_);
  if (!allow_partial && partial) return NULL;

  dmux = (WebPDemuxer*)WebPSafeCalloc(1ULL, sizeof(*dmux));
  if (dmux == NULL) return NULL;
  InitDemux(dmux, &mem);

  status = PARSE_ERROR;
  for (parser = kMasterChunks; parser->parse != NULL; ++parser) {
    if (!memcmp(parser->id, GetBuffer(&dmux->mem_), TAG_SIZE)) {
      status = parser->parse(dmux);
      if (status == PARSE_OK) dmux->state_ = WEBP_DEMUX_DONE;
      if (status == PARSE_NEED_MORE_DATA && !partial) status = PARSE_ERROR;
      if (status != PARSE_ERROR && !parser->valid(dmux)) status = PARSE_ERROR;
      if (status == PARSE_ERROR) dmux->state_ = WEBP_DEMUX_PARSE_ERROR;
      break;
    }
  }
  if (state != NULL) *state = dmux->state_;

  if (status == PARSE_ERROR) {
    WebPDemuxDelete(dmux);
    return NULL;
  }
  return dmux;
}